

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool util::PrintRecords(SelectStatement *stmt,
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       *cols,table *t,int *selectvalue)

{
  ExprType EVar1;
  pointer pcVar2;
  pointer ppVar3;
  long lVar4;
  Expr *pEVar5;
  pointer ppcVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *ppVar7;
  char cVar8;
  undefined1 uVar9;
  code cVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  ostream *poVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  char *str2;
  int *__s;
  size_t sVar16;
  uint uVar17;
  column *col_1;
  pointer ppcVar18;
  long lVar19;
  column *pcVar20;
  column *pcVar21;
  byte bVar22;
  column *col;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *ppVar23;
  pointer ppVar24;
  int iVar25;
  column *pcVar26;
  bool bVar27;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*> it
  ;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *__range2;
  vector<int,_std::allocator<int>_> printedrecords;
  ifstream os;
  int local_2bc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *local_2b8;
  uint local_2ac;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  *local_2a8;
  size_t local_2a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_298;
  int local_26c;
  char *local_268;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *local_260;
  void *local_258;
  iterator iStack_250;
  int *local_248;
  int *local_240;
  char local_238 [520];
  
  pcVar2 = (t->filename)._M_dataplus._M_p;
  local_2a8 = &local_298;
  local_298.first.field_2._8_8_ = stmt;
  local_298.second = (column *)t;
  local_260 = cols;
  local_240 = selectvalue;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar2,pcVar2 + (t->filename)._M_string_length);
  std::ifstream::ifstream(local_238,(string *)&local_2a8,_S_in|_S_bin);
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Can\'t open table ",0x11);
    pcVar13 = (*(TableRef **)(local_298.first.field_2._8_8_ + 0x10))->name;
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
    }
    else {
      sVar16 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar16);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  else {
    ppVar24 = (local_260->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (local_260->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar24 != ppVar3) {
      do {
        local_2a8 = &local_298;
        pcVar2 = (ppVar24->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,pcVar2,pcVar2 + (ppVar24->first)._M_string_length);
        pcVar20 = ppVar24->second;
        local_298.first.field_2._M_allocated_capacity = (size_type)pcVar20;
        if (pcVar20 == (column *)0x0) {
LAB_0011c56f:
          lVar19 = std::cout;
          *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
               *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)(std::ostream::write + *(long *)(lVar19 + -0x18)) = 8;
          lVar4 = *(long *)(lVar19 + -0x18);
          lVar19 = (long)&std::cout + lVar4;
          if ((&DAT_0012d351)[lVar4] == '\0') {
            uVar9 = std::ios::widen((char)lVar19);
LAB_0011c5b4:
            *(undefined1 *)(lVar19 + 0xe0) = uVar9;
            *(undefined1 *)(lVar19 + 0xe1) = 1;
          }
LAB_0011c5c5:
          *(undefined1 *)(lVar19 + 0xe0) = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_2a8,local_2a0);
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&pcVar20->flag);
          if (iVar11 == 0) goto LAB_0011c56f;
          iVar11 = std::__cxx11::string::compare((char *)&pcVar20->flag);
          lVar19 = std::cout;
          if (iVar11 == 0) {
            *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                 *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
            iVar11 = pcVar20->element_size + 2;
            if (pcVar20->element_size < 7) {
              iVar11 = 8;
            }
            *(long *)(std::ostream::write + *(long *)(lVar19 + -0x18)) = (long)iVar11;
            lVar4 = *(long *)(lVar19 + -0x18);
            lVar19 = (long)&std::cout + lVar4;
            if ((&DAT_0012d351)[lVar4] == '\0') {
              uVar9 = std::ios::widen((char)lVar19);
              goto LAB_0011c5b4;
            }
            goto LAB_0011c5c5;
          }
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8);
        }
        ppVar24 = ppVar24 + 1;
      } while (ppVar24 != ppVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      local_258 = (void *)0x0;
      iStack_250._M_current = (int *)0x0;
      local_248 = (int *)0x0;
      local_2bc = 0;
      ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                 *)CONCAT71((int7)((ulong)pcVar20 >> 8),*(int *)((long)local_298.second + 0x70) < 1)
      ;
      if (0 < *(int *)((long)local_298.second + 0x70)) {
        do {
          pEVar5 = *(Expr **)(local_298.first.field_2._8_8_ + 0x28);
          if (pEVar5 == (Expr *)0x0) {
LAB_0011ccb6:
            local_26c = 0;
            if (0 < local_2bc) {
              uVar17 = 0;
              do {
                _Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (local_258,iStack_250._M_current,&local_26c);
                if (_Var15._M_current != iStack_250._M_current) {
                  ppVar23 = (local_260->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_2b8 = (local_260->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                  local_2ac = uVar17;
                  if (ppVar23 == local_2b8) {
                    iVar11 = 0;
                    iVar25 = 0;
                  }
                  else {
                    iVar25 = 0;
                    iVar11 = 0;
                    do {
                      local_2a8 = &local_298;
                      pcVar2 = (ppVar23->first)._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2a8,pcVar2,
                                 pcVar2 + (ppVar23->first)._M_string_length);
                      pcVar20 = ppVar23->second;
                      local_298.first.field_2._M_allocated_capacity = (size_type)pcVar20;
                      if (pcVar20 != (column *)0x0) {
                        std::istream::seekg(local_238,
                                            (long)pcVar20->col_offset +
                                            (long)*(int *)((long)local_298.second + 0x78) *
                                            (long)local_26c,0);
                        iVar12 = pcVar20->element_truesize;
                        if (iVar12 < 0) {
                          iVar12 = -1;
                        }
                        pcVar13 = (char *)operator_new__((long)iVar12);
                        std::istream::read(local_238,(long)pcVar13);
                        std::istream::seekg(local_238,
                                            (long)pcVar20->col_offset +
                                            (long)*(int *)((long)local_298.second + 0x78) *
                                            (long)local_2bc,0);
                        iVar12 = pcVar20->element_truesize;
                        if (iVar12 < 0) {
                          iVar12 = -1;
                        }
                        str2 = (char *)operator_new__((long)iVar12);
                        std::istream::read(local_238,(long)str2);
                        bVar27 = compareString(pcVar13,str2);
                        iVar25 = iVar25 + (uint)bVar27;
                        iVar11 = iVar11 + 1;
                        operator_delete(pcVar13);
                        operator_delete(str2);
                      }
                      if (local_2a8 != &local_298) {
                        operator_delete(local_2a8);
                      }
                      ppVar23 = ppVar23 + 1;
                    } while (ppVar23 != local_2b8);
                  }
                  uVar17 = local_2ac & 0xff;
                  if (iVar25 == iVar11) {
                    uVar17 = 1;
                  }
                }
                local_26c = local_26c + 1;
              } while (local_26c < local_2bc);
              if ((uVar17 & 1) != 0) goto LAB_0011d0ee;
            }
            ppVar7 = (local_260->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar23 = (local_260->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; ppVar23 != ppVar7;
                ppVar23 = ppVar23 + 1) {
              pcVar2 = (ppVar23->first)._M_dataplus._M_p;
              local_2a8 = &local_298;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a8,pcVar2,pcVar2 + (ppVar23->first)._M_string_length);
              pcVar20 = ppVar23->second;
              local_298.first.field_2._M_allocated_capacity = (size_type)pcVar20;
              if (iStack_250._M_current == local_248) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_258,iStack_250,&local_2bc);
              }
              else {
                *iStack_250._M_current = local_2bc;
                iStack_250._M_current = iStack_250._M_current + 1;
              }
              lVar19 = std::cout;
              if (pcVar20 == (column *)0x0) {
                *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                     *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
                *(undefined8 *)(std::ostream::write + *(long *)(lVar19 + -0x18)) = 8;
                lVar19 = *(long *)(lVar19 + -0x18);
                if ((&DAT_0012d351)[lVar19] == '\0') {
                  cVar10 = (code)std::ios::widen((char)lVar19 + 'p');
                  std::ios::clear[lVar19] = cVar10;
                  (&DAT_0012d351)[lVar19] = 1;
                }
                std::ios::clear[lVar19] = (code)0x20;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_2a8,local_2a0);
              }
              else {
                std::istream::seekg(local_238,
                                    (long)pcVar20->col_offset +
                                    (long)*(int *)((long)local_298.second + 0x78) * (long)local_2bc,
                                    0);
                iVar11 = pcVar20->element_truesize;
                if (iVar11 < 0) {
                  iVar11 = -1;
                }
                __s = (int *)operator_new__((long)iVar11);
                std::istream::read(local_238,(long)__s);
                iVar11 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                lVar19 = std::cout;
                *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                     *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
                if (iVar11 == 0) {
                  *(undefined8 *)(std::ostream::write + *(long *)(lVar19 + -0x18)) = 8;
                  lVar19 = *(long *)(lVar19 + -0x18);
                  if ((&DAT_0012d351)[lVar19] == '\0') {
                    cVar10 = (code)std::ios::widen((char)lVar19 + 'p');
                    std::ios::clear[lVar19] = cVar10;
                    (&DAT_0012d351)[lVar19] = 1;
                  }
                  std::ios::clear[lVar19] = (code)0x20;
                  std::ostream::operator<<((ostream *)&std::cout,*__s);
                  *local_240 = *__s;
                }
                else {
                  iVar11 = pcVar20->element_size + 2;
                  if (pcVar20->element_size < 7) {
                    iVar11 = 8;
                  }
                  *(long *)(std::ostream::write + *(long *)(lVar19 + -0x18)) = (long)iVar11;
                  lVar19 = *(long *)(lVar19 + -0x18);
                  if ((&DAT_0012d351)[lVar19] == '\0') {
                    cVar10 = (code)std::ios::widen((char)lVar19 + 'p');
                    std::ios::clear[lVar19] = cVar10;
                    (&DAT_0012d351)[lVar19] = 1;
                  }
                  std::ios::clear[lVar19] = (code)0x20;
                  sVar16 = strlen((char *)__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)__s,sVar16);
                }
                operator_delete(__s);
              }
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8);
              }
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
            std::ostream::put('p');
            std::ostream::flush();
          }
          else {
            if (((pEVar5->type != kExprOperator) || (pEVar5->opType != SIMPLE_OP)) ||
               (2 < (byte)(pEVar5->opChar - 0x3cU))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Invalide where clause",0x15);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              goto LAB_0011d1f2;
            }
            if ((pEVar5->expr2->type == kExprLiteralInt) || (pEVar5->expr->type == kExprLiteralInt))
            {
              local_2a0 = 0;
              local_298.first._M_dataplus._M_p._0_1_ = 0;
              EVar1 = pEVar5->expr2->type;
              local_2a8 = &local_298;
              if (EVar1 == kExprLiteralString) {
LAB_0011c6d9:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"cannot do compare between int and char",0x26);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                std::ostream::put('p');
                iVar11 = 1;
                std::ostream::flush();
              }
              else {
                if (EVar1 == kExprLiteralInt) {
                  if (pEVar5->expr->type == kExprLiteralString) goto LAB_0011c6d9;
                  pcVar13 = pEVar5->expr->name;
                  strlen(pcVar13);
                  lVar19 = 0x10;
                  std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar13);
                }
                else {
                  pcVar13 = pEVar5->expr2->name;
                  strlen(pcVar13);
                  lVar19 = 8;
                  std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar13);
                }
                sVar16 = local_2a0;
                local_2ac = (uint)ppVar23;
                local_268 = (char *)CONCAT44(local_268._4_4_,
                                             *(undefined4 *)
                                              (*(long *)((long)&(*(Expr **)(local_298.first.field_2.
                                                                            _8_8_ + 0x28))->type +
                                                        lVar19) + 0x48));
                ppcVar18 = (((vector<column_*,_std::allocator<column_*>_> *)
                            &(local_298.second)->element_truesize)->
                           super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                ppcVar6 = (((vector<column_*,_std::allocator<column_*>_> *)
                           &(local_298.second)->element_truesize)->
                          super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
                if (ppcVar18 == ppcVar6) {
                  pcVar20 = (column *)0x0;
                }
                else {
                  local_2b8 = local_2a8;
                  pcVar26 = (column *)0x0;
                  do {
                    pcVar21 = *ppcVar18;
                    bVar27 = sVar16 != (pcVar21->name)._M_string_length;
                    pcVar20 = pcVar21;
                    if (bVar27) {
                      pcVar20 = pcVar26;
                    }
                    if ((!bVar27 && sVar16 != 0) &&
                       (iVar11 = bcmp(local_2b8,(pcVar21->name)._M_dataplus._M_p,sVar16),
                       pcVar20 = pcVar26, iVar11 == 0)) {
                      pcVar20 = pcVar21;
                    }
                    ppcVar18 = ppcVar18 + 1;
                    pcVar26 = pcVar20;
                  } while (ppcVar18 != ppcVar6);
                }
                ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                           *)(ulong)local_2ac;
                if (pcVar20 == (column *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"column ",7);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_2a8,local_2a0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," do not exist in table",0x16);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                  std::ostream::put((char)poVar14);
                  iVar11 = 1;
                  std::ostream::flush();
                }
                else {
                  std::istream::seekg(local_238,
                                      (long)pcVar20->col_offset +
                                      (long)*(int *)((long)local_298.second + 0x78) *
                                      (long)local_2bc,0);
                  iVar11 = pcVar20->element_truesize;
                  if (iVar11 < 0) {
                    iVar11 = -1;
                  }
                  local_2b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                               *)operator_new__((long)iVar11);
                  std::istream::read(local_238,(long)local_2b8);
                  if ((*(Expr **)(local_298.first.field_2._8_8_ + 0x28))->opChar == '=') {
                    iVar11 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                    pcVar13 = "cannot do = for char columns with int value";
                    if (iVar11 == 0) {
LAB_0011c9b9:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,pcVar13,0x2b);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                      std::ostream::put('p');
                      std::ostream::flush();
                      iVar25 = 1;
                    }
                    else {
                      iVar25 = 6;
                      if (*(int *)&(local_2b8->first)._M_dataplus._M_p == (int)local_268)
                      goto LAB_0011c8a8;
                    }
LAB_0011c9f3:
                    iVar11 = iVar25;
                    operator_delete(local_2b8);
                  }
                  else {
LAB_0011c8a8:
                    if ((*(Expr **)(local_298.first.field_2._8_8_ + 0x28))->opChar == '>') {
                      iVar11 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                      pcVar13 = "cannot do > for char columns with int value";
                      if (iVar11 == 0) goto LAB_0011c9b9;
                      iVar25 = 6;
                      if (*(int *)&(local_2b8->first)._M_dataplus._M_p <= (int)local_268)
                      goto LAB_0011c9f3;
                    }
                    iVar11 = 0;
                    if ((*(Expr **)(local_298.first.field_2._8_8_ + 0x28))->opChar == '<') {
                      iVar25 = std::__cxx11::string::compare((char *)&pcVar20->flag);
                      pcVar13 = "cannot do < for char columns with int value";
                      if (iVar25 == 0) goto LAB_0011c9b9;
                      iVar25 = 6;
                      if ((int)local_268 <= *(int *)&(local_2b8->first)._M_dataplus._M_p)
                      goto LAB_0011c9f3;
                    }
                  }
                }
              }
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8);
              }
              if (iVar11 == 0) goto LAB_0011ca17;
            }
            else {
LAB_0011ca17:
              pEVar5 = *(Expr **)(local_298.first.field_2._8_8_ + 0x28);
              EVar1 = pEVar5->expr->type;
              if ((EVar1 == kExprColumnRef) && (pEVar5->expr2->type == kExprColumnRef))
              goto LAB_0011d0ee;
              if ((EVar1 != kExprLiteralString) && (pEVar5->expr2->type != kExprLiteralString))
              goto LAB_0011ccb6;
              local_2a0 = 0;
              local_298.first._M_dataplus._M_p._0_1_ = 0;
              local_2a8 = &local_298;
              if (pEVar5->expr2->type == kExprLiteralString) {
                pcVar13 = pEVar5->expr->name;
                strlen(pcVar13);
                lVar19 = 0x10;
                std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar13);
              }
              else {
                pcVar13 = pEVar5->expr2->name;
                strlen(pcVar13);
                lVar19 = 8;
                std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar13);
              }
              sVar16 = local_2a0;
              local_268 = *(char **)(*(long *)((long)&(*(Expr **)(local_298.first.field_2._8_8_ +
                                                                 0x28))->type + lVar19) + 0x28);
              ppcVar18 = (((vector<column_*,_std::allocator<column_*>_> *)
                          &(local_298.second)->element_truesize)->
                         super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              ppcVar6 = (((vector<column_*,_std::allocator<column_*>_> *)
                         &(local_298.second)->element_truesize)->
                        super__Vector_base<column_*,_std::allocator<column_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              local_2ac = (uint)ppVar23;
              if (ppcVar18 == ppcVar6) {
                pcVar20 = (column *)0x0;
              }
              else {
                local_2b8 = local_2a8;
                pcVar20 = (column *)0x0;
                do {
                  pcVar26 = *ppcVar18;
                  bVar27 = sVar16 != (pcVar26->name)._M_string_length;
                  pcVar21 = pcVar26;
                  if (bVar27) {
                    pcVar21 = pcVar20;
                  }
                  if ((!bVar27 && sVar16 != 0) &&
                     (iVar11 = bcmp(local_2b8,(pcVar26->name)._M_dataplus._M_p,sVar16),
                     pcVar21 = pcVar20, iVar11 == 0)) {
                    pcVar21 = pcVar26;
                  }
                  pcVar20 = pcVar21;
                  ppcVar18 = ppcVar18 + 1;
                } while (ppcVar18 != ppcVar6);
              }
              ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                         *)(ulong)local_2ac;
              if (pcVar20 == (column *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"column ",7);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_2a8,local_2a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," do not exist in table",0x16);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                iVar11 = 1;
                std::ostream::flush();
              }
              else {
                std::istream::seekg(local_238,
                                    (long)pcVar20->col_offset +
                                    (long)*(int *)((long)local_298.second + 0x78) * (long)local_2bc,
                                    0);
                iVar11 = pcVar20->element_truesize;
                if (iVar11 < 0) {
                  iVar11 = -1;
                }
                pcVar13 = (char *)operator_new__((long)iVar11);
                std::istream::read(local_238,(long)pcVar13);
                cVar8 = (*(Expr **)(local_298.first.field_2._8_8_ + 0x28))->opChar;
                iVar11 = 0;
                if (cVar8 == '<') {
                  iVar25 = compareChar(pcVar13,local_268);
                  iVar11 = 0;
                  if (iVar25 != -1) goto LAB_0011cc83;
                }
                else if (cVar8 == '>') {
                  iVar25 = compareChar(pcVar13,local_268);
                  if (iVar25 != 1) goto LAB_0011cc83;
                }
                else if ((cVar8 == '=') && (bVar27 = compareString(pcVar13,local_268), !bVar27)) {
LAB_0011cc83:
                  operator_delete(pcVar13);
                  iVar11 = 6;
                }
              }
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8);
              }
              if (iVar11 == 0) goto LAB_0011ccb6;
            }
            if (iVar11 != 6) goto LAB_0011d1f2;
          }
LAB_0011d0ee:
          local_2bc = local_2bc + 1;
          ppVar23 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
                     *)CONCAT71((int7)((ulong)ppVar23 >> 8),
                                *(int *)((long)local_298.second + 0x70) <= local_2bc);
        } while (local_2bc < *(int *)((long)local_298.second + 0x70));
      }
      std::ifstream::close();
LAB_0011d1f2:
      bVar22 = (byte)ppVar23;
      if (local_258 != (void *)0x0) {
        operator_delete(local_258);
      }
      goto LAB_0011d201;
    }
  }
  bVar22 = 0;
LAB_0011d201:
  std::ifstream::~ifstream(local_238);
  return (bool)(bVar22 & 1);
}

Assistant:

bool util::PrintRecords(hsql::SelectStatement *stmt, vector<pair<string, column*>> cols, table* t, int &selectvalue){
    ifstream os(t->getName(), ios::in|ios::binary);

    if(!os.is_open()){
        cout <<"Can't open table "<< stmt->fromTable->name  <<endl;
        return false;
    }
    if(cols.empty()){
        return false;
    }
    // header
    for(auto it : cols){
        column* col = it.second;
        if(col == NULL || col->flag == "INT")
            cout <<left<<setw(8)<<setfill(' ')<<it.first;
        else if(col->flag == "CHAR")
            cout <<left<<setw(col->element_size +2 > 8 ? col->element_size+2 : 8)<<setfill(' ')<<it.first;
    }
    cout << endl;

    vector<int> printedrecords;
    //print records
    for(int i = 0; i < t->getRowlength(); i++){

        //where condition
        if(stmt->whereClause != NULL){
            if(stmt->whereClause->type != hsql::kExprOperator ||
               stmt->whereClause->opType != hsql::Expr::SIMPLE_OP||
               (stmt->whereClause->opChar != '=' && stmt->whereClause->opChar != '>'&&
                stmt->whereClause->opChar != '<')){
                cout <<"Invalide where clause"<<endl;
                return false;
            }
            //deal with int
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt||stmt->whereClause->expr->type == hsql::kExprLiteralInt){
                //select column
                string colName;
                int compareNum;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt) {
                    if(stmt->whereClause->expr->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr->name;
                    compareNum = (int) stmt->whereClause->expr2->ival;
                }
                else {
                    if(stmt->whereClause->expr2->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr2->name;
                    compareNum = (int) stmt->whereClause->expr->ival;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do = for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if(stmt->whereClause->opChar == '>'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do > for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes <= compareNum){
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if(stmt->whereClause->opChar == '<'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do < for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes >= compareNum){
                        delete bytes;
                        continue;
                    }
                }

            }
            if(stmt->whereClause->expr->type == hsql::kExprColumnRef&&stmt->whereClause->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralString||stmt->whereClause->expr->type == hsql::kExprLiteralString){
                //select column
                string colName;
                char* compareChar;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->whereClause->expr->name;
                    compareChar = stmt->whereClause->expr2->name;
                }
                else {
                    colName = stmt->whereClause->expr2->name;
                    compareChar = stmt->whereClause->expr->name;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if (!util::compareString(bytes ,compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if(stmt->whereClause->opChar == '>'){
                    if(util::compareChar(bytes, compareChar) != 1){
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if(stmt->whereClause->opChar == '<'){
                    if(util::compareChar(bytes, compareChar) != -1){
                        delete bytes;
                        continue;
                    }
                }

            }

        }
        //check duplicates
        bool duplicates = false;
        for(int j = 0; j<i; j++){
            if(find(printedrecords.begin(), printedrecords.end(), j)== printedrecords.end())
                continue;
            int count_duplicates = 0;
            int countcol = 0;
            for(auto it:cols){
                column* col = it.second;
                if (col!=NULL){
                    os.seekg(j * t->getrowSize() + col->col_offset);
                    char* prebytes = new char[col->element_truesize];
                    os.read(prebytes, col->element_truesize);

                    os.seekg(i * t->getrowSize() + col->col_offset);
                    char* curbytes = new char[col->element_truesize];
                    os.read(curbytes, col->element_truesize);
                    if(util::compareString(prebytes, curbytes))
                        count_duplicates += 1;
                    countcol += 1;
                    delete prebytes;
                    delete curbytes;
                }

            }
            if(count_duplicates == countcol)
                duplicates = true;
        }
        if(duplicates)
            continue;
        //do print

        for(auto it:cols) {
            column *col = it.second;
            printedrecords.push_back(i);

            if (col != NULL) {

                os.seekg(i * t->getrowSize() + col->col_offset);
                char *bytes = new char[col->element_truesize];
                //cout << "bytes: " << bytes << " -- true size: " << col->element_truesize << endl;
                os.read(bytes, col->element_truesize);


                if ( col->flag == "INT"){
                    cout << left << setw(8) << setfill(' ') << *(int *) bytes;
                    selectvalue = *(int *) bytes;

                }

                else {
                    cout << left << setw(col->element_size + 2 > 8 ? col->element_size + 2 : 8)
                         << setfill(' ') << bytes;
                }

                delete bytes;

            } else {
                cout << left << setw(8) << setfill(' ') << it.first;
            }
        }
        cout << endl;
    }
    os.close();
    return true;
}